

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  Value *pVVar1;
  Value *in_RDI;
  Value *unaff_retaddr;
  ArrayIndex in_stack_00000084;
  Value *in_stack_00000088;
  Value *in_stack_ffffffffffffff98;
  Value *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffd0;
  
  Value(unaff_retaddr,in_RDI);
  size(in_stack_ffffffffffffffb8);
  operator[](in_stack_00000088,in_stack_00000084);
  pVVar1 = operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ~Value(in_stack_ffffffffffffffd0);
  return pVVar1;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }